

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

StructBuilder * __thiscall
capnp::_::OrphanBuilder::asStruct
          (StructBuilder *__return_storage_ptr__,OrphanBuilder *this,StructSize size)

{
  OrphanBuilder *pOVar1;
  ushort uVar2;
  ushort uVar3;
  SegmentId id;
  CapTableBuilder *capTable;
  BuilderArena *this_00;
  word *pwVar4;
  ushort uVar5;
  SegmentBuilder *this_01;
  SegmentBuilder *pSVar6;
  SegmentBuilder *pSVar7;
  undefined8 *puVar8;
  ushort uVar9;
  OrphanBuilder *pOVar10;
  StructSize SVar13;
  uint uVar11;
  WirePointer *pWVar12;
  WirePointer *src;
  StructSize SVar14;
  word *pwVar15;
  ushort uVar16;
  uint uVar17;
  ulong uVar18;
  WirePointer *dst;
  word *result;
  AllocateResult AVar19;
  uint local_68;
  DebugComparison<capnp::_::WirePointer::Kind,_capnp::_::WirePointer::Kind> _kjCondition;
  Fault f;
  
  pSVar7 = this->segment;
  capTable = this->capTable;
  this_00 = (BuilderArena *)(pSVar7->super_SegmentReader).arena;
  uVar11 = (uint)(this->tag).content;
  id.value = *(uint *)((long)&(this->tag).content + 4);
  uVar16 = size.data;
  uVar9 = size.pointers;
  if (id.value != 0 || uVar11 != 0) {
    if ((uVar11 & 3) == 2) {
      this_01 = BuilderArena::getSegment(this_00,id);
      uVar11 = (uint)(this->tag).content;
      pwVar15 = (this_01->super_SegmentReader).ptr.ptr;
      uVar18 = (ulong)(uVar11 & 0xfffffff8);
      pOVar1 = (OrphanBuilder *)((long)&pwVar15->content + uVar18);
      pOVar10 = (OrphanBuilder *)((long)&pwVar15[1].content + uVar18);
      if ((uVar11 & 4) == 0) {
        pwVar15 = &pOVar10->tag + ((int)(pOVar1->tag).content >> 2);
        pOVar10 = pOVar1;
      }
      else {
        this_01 = BuilderArena::getSegment
                            ((BuilderArena *)(this_01->super_SegmentReader).arena,
                             (SegmentId)*(uint *)((long)&(pOVar1->tag).content + 4));
        pwVar15 = (word *)((long)&((this_01->super_SegmentReader).ptr.ptr)->content +
                          (ulong)((uint)(pOVar1->tag).content & 0xfffffff8));
      }
    }
    else {
      pwVar15 = this->location;
      this_01 = pSVar7;
      pOVar10 = this;
    }
    AVar19.words = pwVar15;
    AVar19.segment = this_01;
    if (this_01->readOnly == true) {
      SegmentBuilder::throwNotWritable(this_01);
    }
    _kjCondition.left = (Kind)(pOVar10->tag).content & OTHER;
    _kjCondition.result = _kjCondition.left == STRUCT;
    _kjCondition.right = STRUCT;
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    if (_kjCondition.result) {
      uVar2 = *(ushort *)((long)&(pOVar10->tag).content + 4);
      uVar3 = *(ushort *)((long)&(pOVar10->tag).content + 6);
      uVar18 = (ulong)uVar3;
      src = (WirePointer *)(pwVar15 + uVar2);
      SVar13.pointers = 0;
      SVar13.data = uVar2;
      pWVar12 = src;
      uVar5 = uVar3;
      if (uVar3 < uVar9 || uVar2 < uVar16) {
        SVar14 = SVar13;
        if (uVar2 <= uVar16) {
          SVar14 = size;
        }
        uVar11 = (uint)size >> 0x10;
        if (uVar9 < uVar3) {
          uVar11 = (uint)uVar3;
        }
        SVar13 = (StructSize)((uint)SVar14 & 0xffff);
        if ((((this->tag).content & 3) == 2) &&
           (pSVar6 = BuilderArena::getSegment
                               ((BuilderArena *)(pSVar7->super_SegmentReader).arena,
                                (SegmentId)*(uint *)((long)&(this->tag).content + 4)),
           pSVar6->readOnly == false)) {
          uVar17 = (uint)(this->tag).content;
          puVar8 = (undefined8 *)
                   ((long)&((pSVar6->super_SegmentReader).ptr.ptr)->content +
                   (ulong)(uVar17 & 0xfffffff8));
          if ((uVar17 & 4) == 0) {
            *puVar8 = 0;
          }
          else {
            *puVar8 = 0;
            puVar8[1] = 0;
          }
        }
        AVar19.words = &this->tag;
        AVar19.segment = pSVar7;
        uVar17 = uVar11 + (int)SVar13;
        (this->tag).content = 0;
        pOVar10 = this;
        if (this_00 == (BuilderArena *)0x0) {
          if (uVar17 == 0) {
            *(undefined4 *)&(this->tag).content = 0xfffffffc;
          }
          else {
            pwVar4 = pSVar7->pos;
            AVar19.words = pwVar4;
            if (((long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
                       ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)pwVar4)) >> 3 <
                 (long)(ulong)uVar17) || (pSVar7->pos = pwVar4 + uVar17, pwVar4 == (word *)0x0)) {
              AVar19 = BuilderArena::allocate
                                 ((BuilderArena *)(pSVar7->super_SegmentReader).arena,uVar17 + 1);
              pOVar10 = (OrphanBuilder *)AVar19.words;
              pSVar7 = AVar19.segment;
              *(uint *)&(this->tag).content =
                   (int)AVar19.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U
                   | 2;
              *(uint *)((long)&(this->tag).content + 4) = (pSVar7->super_SegmentReader).id.value;
              *(undefined4 *)&(pOVar10->tag).content = 0;
              AVar19.words = (word *)&pOVar10->segment;
              AVar19.segment = pSVar7;
            }
            else {
              *(uint *)&(this->tag).content =
                   ((uint)((ulong)((long)pwVar4 - (long)this) >> 1) & 0xfffffffc) - 4;
            }
          }
        }
        else {
          AVar19 = BuilderArena::allocate(this_00,uVar17);
          *(undefined4 *)&(this->tag).content = 0xfffffffc;
        }
        *(StructDataWordCount *)((long)&(pOVar10->tag).content + 4) = SVar14.data;
        uVar5 = (ushort)uVar11;
        *(ushort *)((long)&(pOVar10->tag).content + 6) = uVar5;
        if (uVar2 != 0) {
          memcpy(AVar19.words,pwVar15,(ulong)uVar2 << 3);
        }
        pWVar12 = (WirePointer *)(AVar19.words + ((uint)SVar14 & 0xffff));
        dst = pWVar12;
        if (uVar3 != 0) {
          do {
            WireHelpers::transferPointer(AVar19.segment,dst,this_01,src);
            src = src + 1;
            uVar18 = uVar18 - 1;
            dst = dst + 1;
          } while (uVar18 != 0);
        }
        local_68 = (uint)uVar2;
        if (uVar3 + local_68 != 0) {
          memset(pwVar15,0,(ulong)((uVar3 + local_68) * 8));
        }
      }
      goto LAB_001815b3;
    }
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::WirePointer::Kind,capnp::_::WirePointer::Kind>&,char_const(&)[88]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x47b,FAILED,"oldRef->kind() == WirePointer::STRUCT",
               "_kjCondition,\"Schema mismatch: Message contains non-struct pointer where struct pointer was expected.\""
               ,&_kjCondition,
               (char (*) [88])
               "Schema mismatch: Message contains non-struct pointer where struct pointer was expected."
              );
    kj::_::Debug::Fault::~Fault(&f);
  }
  SVar13 = (StructSize)((uint)size & 0xffff);
  uVar11 = ((uint)size >> 0x10) + (int)SVar13;
  pOVar10 = this;
  if (this_00 == (BuilderArena *)0x0) {
    if (*(int *)((long)&(this->tag).content + 4) != 0 || (int)(this->tag).content != 0) {
      WireHelpers::zeroObject(pSVar7,capTable,(WirePointer *)this);
    }
    AVar19.words = &this->tag;
    AVar19.segment = pSVar7;
    if (uVar11 == 0) {
      *(undefined4 *)&(this->tag).content = 0xfffffffc;
    }
    else {
      pwVar15 = pSVar7->pos;
      AVar19.words = pwVar15;
      if (((long)((long)(pSVar7->super_SegmentReader).ptr.ptr +
                 ((pSVar7->super_SegmentReader).ptr.size_ * 8 - (long)pwVar15)) >> 3 <
           (long)(ulong)uVar11) || (pSVar7->pos = pwVar15 + uVar11, pwVar15 == (word *)0x0)) {
        AVar19 = BuilderArena::allocate
                           ((BuilderArena *)(pSVar7->super_SegmentReader).arena,uVar11 + 1);
        pOVar10 = (OrphanBuilder *)AVar19.words;
        pSVar7 = AVar19.segment;
        *(uint *)&(this->tag).content =
             (int)AVar19.words - *(int *)&(pSVar7->super_SegmentReader).ptr.ptr & 0xfffffff8U | 2;
        *(uint *)((long)&(this->tag).content + 4) = (pSVar7->super_SegmentReader).id.value;
        *(undefined4 *)&(pOVar10->tag).content = 0;
        AVar19.words = (word *)&pOVar10->segment;
        AVar19.segment = pSVar7;
      }
      else {
        *(uint *)&(this->tag).content =
             ((uint)((ulong)((long)pwVar15 - (long)this) >> 1) & 0xfffffffc) - 4;
      }
    }
  }
  else {
    AVar19 = BuilderArena::allocate(this_00,uVar11);
    *(undefined4 *)&(this->tag).content = 0xfffffffc;
  }
  *(ushort *)((long)&(pOVar10->tag).content + 4) = uVar16;
  *(ushort *)((long)&(pOVar10->tag).content + 6) = uVar9;
  pWVar12 = (WirePointer *)(AVar19.words + (uint)SVar13);
  uVar5 = uVar9;
LAB_001815b3:
  __return_storage_ptr__->segment = AVar19.segment;
  __return_storage_ptr__->capTable = capTable;
  __return_storage_ptr__->data = AVar19.words;
  __return_storage_ptr__->pointers = pWVar12;
  __return_storage_ptr__->dataSize = (int)SVar13 << 6;
  __return_storage_ptr__->pointerCount = uVar5;
  this->location = AVar19.words;
  return __return_storage_ptr__;
}

Assistant:

StructBuilder OrphanBuilder::asStruct(StructSize size) {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  StructBuilder result = WireHelpers::getWritableStructPointer(
      tagAsPtr(), location, segment, capTable, size, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  location = reinterpret_cast<word*>(result.data);

  return result;
}